

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O1

int ap_str_to_hex(char *str,char **hex_str)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  
  sVar3 = strlen(str);
  pcVar4 = (char *)malloc(sVar3 * 2 + 1);
  if (pcVar4 == (char *)0x0) {
    iVar2 = 4;
  }
  else {
    if (sVar3 != 0) {
      sVar5 = 0;
      do {
        bVar1 = str[sVar5];
        pcVar4[sVar5 * 2] = "0123456789ABCDEF"[(char)bVar1 >> 4];
        pcVar4[sVar5 * 2 + 1] = "0123456789ABCDEF"[bVar1 & 0xf];
        sVar5 = sVar5 + 1;
      } while (sVar3 != sVar5);
    }
    pcVar4[sVar3 * 2] = '\0';
    *hex_str = pcVar4;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ap_str_to_hex (const char *str, char **hex_str)
{
	static unsigned char hex_tab[16] = "0123456789ABCDEF";

	int		rc			= AP_NO_ERROR;
	char	*s			= NULL;
	size_t	str_len;
	size_t	i;

	str_len = strlen (str);

	s = malloc (str_len * 2 + 1);
	if (s == NULL)
	{
		rc = AP_ERROR_NO_MEMORY;

		goto finish;
	}

	for (i = 0; i < str_len; i ++)
	{
		s[i * 2] = hex_tab[str[i] >> 4];
		s[i * 2 + 1] = hex_tab[str[i] & 0x0F];
	}

	s[str_len * 2] = '\0';

	*hex_str = s;

finish:
	return rc;
}